

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O2

int64_t tar_atol_base_n(char *p,size_t char_cnt,wchar_t base)

{
  char cVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  wchar_t wVar8;
  int64_t iVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  
  uVar10 = CONCAT44(0,base);
  iVar9 = 0x7fffffffffffffff;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar10;
  auVar3 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff);
  lVar5 = SUB168(auVar3 / auVar2,0);
  lVar6 = SUB168(auVar3 % auVar2,0);
  uVar12 = 0;
  while( true ) {
    lVar11 = char_cnt - uVar12;
    if (lVar11 == 0) {
      return 0;
    }
    cVar1 = p[uVar12];
    if ((cVar1 != '\t') && (cVar1 != ' ')) break;
    uVar12 = uVar12 + 1;
  }
  if (cVar1 == '-') {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = SUB168(SEXT816(-0x8000000000000000),8);
    auVar2 = auVar3 << 0x40 | ZEXT816(0x8000000000000000);
    lVar6 = SUB168(auVar2 % SEXT816((long)uVar10),0);
    if (char_cnt - 1 == uVar12) {
      return 0;
    }
    lVar11 = ~uVar12 + char_cnt;
    lVar5 = -SUB168(auVar2 / SEXT816((long)uVar10),0);
    iVar9 = -0x8000000000000000;
    bVar4 = true;
    uVar12 = uVar12 + 1;
  }
  else {
    bVar4 = false;
  }
  lVar7 = 0;
  lVar13 = 0;
  while( true ) {
    if ((((p + uVar12)[lVar7] < 0x30) ||
        (wVar8 = (p + uVar12)[lVar7] + L'\xffffffd0', base <= wVar8)) || (lVar11 == lVar7)) {
      if (!bVar4) {
        return lVar13;
      }
      return -lVar13;
    }
    if (lVar5 < lVar13) {
      return iVar9;
    }
    if ((lVar13 == lVar5) && (lVar6 < (long)(ulong)(uint)wVar8)) break;
    lVar13 = lVar13 * uVar10 + (ulong)(uint)wVar8;
    lVar7 = lVar7 + 1;
  }
  return iVar9;
}

Assistant:

static int64_t
tar_atol_base_n(const char *p, size_t char_cnt, int base)
{
	int64_t	l, maxval, limit, last_digit_limit;
	int digit, sign;

	maxval = INT64_MAX;
	limit = INT64_MAX / base;
	last_digit_limit = INT64_MAX % base;

	/* the pointer will not be dereferenced if char_cnt is zero
	 * due to the way the && operator is evaluated.
	 */
	while (char_cnt != 0 && (*p == ' ' || *p == '\t')) {
		p++;
		char_cnt--;
	}

	sign = 1;
	if (char_cnt != 0 && *p == '-') {
		sign = -1;
		p++;
		char_cnt--;

		maxval = INT64_MIN;
		limit = -(INT64_MIN / base);
		last_digit_limit = INT64_MIN % base;
	}

	l = 0;
	if (char_cnt != 0) {
		digit = *p - '0';
		while (digit >= 0 && digit < base  && char_cnt != 0) {
			if (l>limit || (l == limit && digit > last_digit_limit)) {
				return maxval; /* Truncate on overflow. */
			}
			l = (l * base) + digit;
			digit = *++p - '0';
			char_cnt--;
		}
	}
	return (sign < 0) ? -l : l;
}